

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void poolDestroy(STRING_POOL *pool)

{
  block *pbVar1;
  BLOCK *pBVar2;
  
  pBVar2 = pool->blocks;
  while (pBVar2 != (BLOCK *)0x0) {
    pbVar1 = pBVar2->next;
    (*pool->mem->free_fcn)(pBVar2);
    pBVar2 = pbVar1;
  }
  pBVar2 = pool->freeBlocks;
  while (pBVar2 != (BLOCK *)0x0) {
    pbVar1 = pBVar2->next;
    (*pool->mem->free_fcn)(pBVar2);
    pBVar2 = pbVar1;
  }
  return;
}

Assistant:

static void FASTCALL
poolDestroy(STRING_POOL *pool) {
  BLOCK *p = pool->blocks;
  while (p) {
    BLOCK *tem = p->next;
    pool->mem->free_fcn(p);
    p = tem;
  }
  p = pool->freeBlocks;
  while (p) {
    BLOCK *tem = p->next;
    pool->mem->free_fcn(p);
    p = tem;
  }
}